

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O2

void __thiscall zmq::mailbox_safe_t::~mailbox_safe_t(mailbox_safe_t *this)

{
  mutex_t::lock(this->_sync);
  mutex_t::unlock(this->_sync);
  std::_Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>::~_Vector_base
            (&(this->_signalers).
              super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>);
  std::_V2::condition_variable_any::~condition_variable_any(&(this->_cond_var)._cv);
  yqueue_t<zmq::command_t,_16>::~yqueue_t(&(this->_cpipe)._queue);
  return;
}

Assistant:

zmq::mailbox_safe_t::~mailbox_safe_t ()
{
    //  TODO: Retrieve and deallocate commands inside the cpipe.

    // Work around problem that other threads might still be in our
    // send() method, by waiting on the mutex before disappearing.
    _sync->lock ();
    _sync->unlock ();
}